

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  undefined8 *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  long lVar5;
  int i;
  int i_1;
  long lVar6;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  long local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absdiag;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mindiag;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined1 local_ec;
  undefined8 local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxdiag;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_1e8,0.0,(type *)0x0);
  iVar4 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  local_1a8 = __return_storage_ptr__;
  if (iVar4 == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1e8,1.0);
      lVar5 = 0;
      lVar6 = 0;
      while( true ) {
        iVar4 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar4 <= lVar6) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_1e8,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar5));
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x38;
      }
      maxdiag.m_backend.data._M_elems[0] = 0;
      maxdiag.m_backend.data._M_elems[1] = 0x3ff00000;
      mindiag.m_backend.fpclass = cpp_dec_float_finite;
      mindiag.m_backend.prec_elem = 10;
      mindiag.m_backend.data._M_elems[0] = 0;
      mindiag.m_backend.data._M_elems[1] = 0;
      mindiag.m_backend.data._M_elems[2] = 0;
      mindiag.m_backend.data._M_elems[3] = 0;
      mindiag.m_backend.data._M_elems[4] = 0;
      mindiag.m_backend.data._M_elems[5] = 0;
      mindiag.m_backend.data._M_elems._24_5_ = 0;
      mindiag.m_backend.data._M_elems[7]._1_3_ = 0;
      mindiag.m_backend.data._M_elems._32_5_ = 0;
      mindiag.m_backend.data._M_elems[9]._1_3_ = 0;
      mindiag.m_backend.exp = 0;
      mindiag.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (&mindiag.m_backend,(double *)&maxdiag,&local_1e8);
      local_1e8.data._M_elems[9]._1_3_ = mindiag.m_backend.data._M_elems[9]._1_3_;
      local_1e8.data._M_elems._32_5_ = mindiag.m_backend.data._M_elems._32_5_;
      local_1e8.data._M_elems[7]._1_3_ = mindiag.m_backend.data._M_elems[7]._1_3_;
      local_1e8.data._M_elems._24_5_ = mindiag.m_backend.data._M_elems._24_5_;
      local_1e8.data._M_elems[4] = mindiag.m_backend.data._M_elems[4];
      local_1e8.data._M_elems[5] = mindiag.m_backend.data._M_elems[5];
      local_1e8.data._M_elems[0] = mindiag.m_backend.data._M_elems[0];
      local_1e8.data._M_elems[1] = mindiag.m_backend.data._M_elems[1];
      local_1e8.data._M_elems[2] = mindiag.m_backend.data._M_elems[2];
      local_1e8.data._M_elems[3] = mindiag.m_backend.data._M_elems[3];
      local_1e8.exp = mindiag.m_backend.exp;
      local_1e8.neg = mindiag.m_backend.neg;
      local_1e8.fpclass = mindiag.m_backend.fpclass;
      local_1e8.prec_elem = mindiag.m_backend.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1e8,0.0);
      lVar5 = 0;
      lVar6 = 0;
      while( true ) {
        iVar4 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar4 <= lVar6) break;
        maxdiag.m_backend.data._M_elems[0] = 0;
        maxdiag.m_backend.data._M_elems[1] = 0x3ff00000;
        mindiag.m_backend.fpclass = cpp_dec_float_finite;
        mindiag.m_backend.prec_elem = 10;
        mindiag.m_backend.data._M_elems[0] = 0;
        mindiag.m_backend.data._M_elems[1] = 0;
        mindiag.m_backend.data._M_elems[2] = 0;
        mindiag.m_backend.data._M_elems[3] = 0;
        mindiag.m_backend.data._M_elems[4] = 0;
        mindiag.m_backend.data._M_elems[5] = 0;
        mindiag.m_backend.data._M_elems._24_5_ = 0;
        mindiag.m_backend.data._M_elems[7]._1_3_ = 0;
        mindiag.m_backend.data._M_elems._32_5_ = 0;
        mindiag.m_backend.data._M_elems[9]._1_3_ = 0;
        mindiag.m_backend.exp = 0;
        mindiag.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&mindiag.m_backend,(double *)&maxdiag,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar5));
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_1e8,&mindiag.m_backend);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x38;
      }
    }
    else if (type == 0) {
      pnVar2 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8);
      local_68 = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
      uStack_60 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2);
      local_58 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4);
      uStack_50 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 6);
      local_40 = (pnVar2->m_backend).exp;
      local_3c = (pnVar2->m_backend).neg;
      local_38._0_4_ = (pnVar2->m_backend).fpclass;
      local_38._4_4_ = (pnVar2->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&mindiag,(multiprecision *)&local_68,arg);
      pnVar2 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8);
      local_a8 = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
      uStack_a0 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2);
      local_98 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4);
      uStack_90 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 6);
      local_80 = (pnVar2->m_backend).exp;
      local_7c = (pnVar2->m_backend).neg;
      local_78._0_4_ = (pnVar2->m_backend).fpclass;
      local_78._4_4_ = (pnVar2->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&maxdiag,(multiprecision *)&local_a8,arg_00);
      lVar5 = 1;
      lVar6 = 0x68;
      while( true ) {
        iVar4 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar4 <= lVar5) break;
        pnVar2 = (this->
                 super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).diag.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_f8 = *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x10);
        puVar1 = (undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x30);
        local_118 = *puVar1;
        uStack_110 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x20);
        local_108 = *puVar1;
        uStack_100 = puVar1[1];
        local_f0 = *(undefined4 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -8);
        local_ec = *(undefined1 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -4);
        local_e8 = *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&absdiag,(multiprecision *)&local_118,arg_01);
        tVar3 = boost::multiprecision::operator<(&absdiag,&mindiag);
        b = &mindiag;
        if (tVar3) {
LAB_0024c154:
          *(ulong *)((b->m_backend).data._M_elems + 8) =
               CONCAT35(absdiag.m_backend.data._M_elems[9]._1_3_,
                        absdiag.m_backend.data._M_elems._32_5_);
          *(undefined8 *)((b->m_backend).data._M_elems + 4) = absdiag.m_backend.data._M_elems._16_8_
          ;
          *(ulong *)((b->m_backend).data._M_elems + 6) =
               CONCAT35(absdiag.m_backend.data._M_elems[7]._1_3_,
                        absdiag.m_backend.data._M_elems._24_5_);
          *(undefined8 *)(b->m_backend).data._M_elems = absdiag.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((b->m_backend).data._M_elems + 2) = absdiag.m_backend.data._M_elems._8_8_;
          (b->m_backend).exp = absdiag.m_backend.exp;
          (b->m_backend).neg = absdiag.m_backend.neg;
          (b->m_backend).fpclass = absdiag.m_backend.fpclass;
          (b->m_backend).prec_elem = absdiag.m_backend.prec_elem;
        }
        else {
          b = &maxdiag;
          local_1a0 = lVar5;
          tVar3 = boost::multiprecision::operator>(&absdiag,b);
          lVar5 = local_1a0;
          if (tVar3) goto LAB_0024c154;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x38;
      }
      absdiag.m_backend.fpclass = cpp_dec_float_finite;
      absdiag.m_backend.prec_elem = 10;
      absdiag.m_backend.data._M_elems[0] = 0;
      absdiag.m_backend.data._M_elems[1] = 0;
      absdiag.m_backend.data._M_elems[2] = 0;
      absdiag.m_backend.data._M_elems[3] = 0;
      absdiag.m_backend.data._M_elems[4] = 0;
      absdiag.m_backend.data._M_elems[5] = 0;
      absdiag.m_backend.data._M_elems._24_5_ = 0;
      absdiag.m_backend.data._M_elems[7]._1_3_ = 0;
      absdiag.m_backend.data._M_elems._32_5_ = 0;
      absdiag.m_backend.data._M_elems[9]._1_3_ = 0;
      absdiag.m_backend.exp = 0;
      absdiag.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&absdiag.m_backend,&maxdiag.m_backend,&mindiag.m_backend);
      local_1e8.data._M_elems[9]._1_3_ = absdiag.m_backend.data._M_elems[9]._1_3_;
      local_1e8.data._M_elems._32_5_ = absdiag.m_backend.data._M_elems._32_5_;
      local_1e8.data._M_elems[7]._1_3_ = absdiag.m_backend.data._M_elems[7]._1_3_;
      local_1e8.data._M_elems._24_5_ = absdiag.m_backend.data._M_elems._24_5_;
      local_1e8.data._M_elems[4] = absdiag.m_backend.data._M_elems[4];
      local_1e8.data._M_elems[5] = absdiag.m_backend.data._M_elems[5];
      local_1e8.data._M_elems[0] = absdiag.m_backend.data._M_elems[0];
      local_1e8.data._M_elems[1] = absdiag.m_backend.data._M_elems[1];
      local_1e8.data._M_elems[2] = absdiag.m_backend.data._M_elems[2];
      local_1e8.data._M_elems[3] = absdiag.m_backend.data._M_elems[3];
      local_1e8.exp = absdiag.m_backend.exp;
      local_1e8.neg = absdiag.m_backend.neg;
      local_1e8.fpclass = absdiag.m_backend.fpclass;
      local_1e8.prec_elem = absdiag.m_backend.prec_elem;
    }
    *(undefined8 *)((local_1a8->m_backend).data._M_elems + 8) = local_1e8.data._M_elems._32_8_;
    *(undefined8 *)((local_1a8->m_backend).data._M_elems + 4) = local_1e8.data._M_elems._16_8_;
    *(undefined8 *)((local_1a8->m_backend).data._M_elems + 6) = local_1e8.data._M_elems._24_8_;
    *(undefined8 *)(local_1a8->m_backend).data._M_elems = local_1e8.data._M_elems._0_8_;
    *(undefined8 *)((local_1a8->m_backend).data._M_elems + 2) = local_1e8.data._M_elems._8_8_;
    (local_1a8->m_backend).exp = local_1e8.exp;
    (local_1a8->m_backend).neg = local_1e8.neg;
    (local_1a8->m_backend).fpclass = local_1e8.fpclass;
    (local_1a8->m_backend).prec_elem = local_1e8.prec_elem;
  }
  return local_1a8;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}